

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(*this + 0xa8))(&local_30);
  std::operator+(&local_50,
                 "#version 310 es                                       \nin mediump vec4 v_in_0;                            \nflat out mediump vec4 v_out_0;                     \n"
                 ,&local_30);
  std::operator+(__return_storage_ptr__,&local_50,
                 "void main() {                                      \n    gl_Position = vec4(0, 0, 0, 1);                \n#ifdef GL_ES                                       \n    gl_PointSize = 1.0f;                           \n#endif                                             \n    v_out_0 = test_function(v_in_0);               \n}"
                );
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                                       \n"
			   ""
			   "in mediump vec4 v_in_0;                            \n"
			   "flat out mediump vec4 v_out_0;                     \n" +
			   TestFunction() + "void main() {                                      \n"
								"    gl_Position = vec4(0, 0, 0, 1);                \n"
								"#ifdef GL_ES                                       \n"
								"    gl_PointSize = 1.0f;                           \n"
								"#endif                                             \n"
								"    v_out_0 = test_function(v_in_0);               \n"
								"}";
	}